

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O2

lgx_co_t * lgx_co_create(lgx_vm_t *vm,lgx_function_t *fun)

{
  lgx_co_s *plVar1;
  lgx_list_s *plVar2;
  int iVar3;
  lgx_co_t *co;
  unsigned_long_long uVar4;
  uint size;
  
  if (((vm->co_count < 0x100001) && (fun->buildin == (_func_int_lgx_vm_s_ptr *)0x0)) &&
     (co = (lgx_co_t *)calloc(1,0x68), co != (lgx_co_t *)0x0)) {
    size = 0x10;
    if (0x10 < fun->stack_size) {
      size = fun->stack_size;
    }
    iVar3 = lgx_co_stack_init(&co->stack,size);
    if (iVar3 == 0) {
      plVar1 = vm->co_running;
      if (plVar1 != (lgx_co_s *)0x0) {
        plVar1->ref_cnt = plVar1->ref_cnt + 1;
        co->parent = plVar1;
      }
      co->pc = fun->addr;
      co->on_yield = (_func_int_lgx_vm_t_ptr *)0x0;
      co->vm = vm;
      co->status = CO_READY;
      plVar2 = (vm->co_ready).prev;
      (vm->co_ready).prev = (lgx_list_s *)co;
      (co->head).next = &vm->co_ready;
      (co->head).prev = plVar2;
      plVar2->next = (lgx_list_s *)co;
      lgx_co_set_function(co,0,fun);
      lgx_co_set_long(co,1,1);
      lgx_co_set_long(co,2,-1);
      lgx_co_set_long(co,3,-1);
      uVar4 = vm->co_id + 1;
      vm->co_id = uVar4;
      co->id = uVar4;
      vm->co_count = vm->co_count + 1;
      return co;
    }
    free(co);
  }
  return (lgx_co_t *)0x0;
}

Assistant:

lgx_co_t* lgx_co_create(lgx_vm_t *vm, lgx_function_t *fun) {
    if (vm->co_count > LGX_MAX_CO_LIMIT) {
        return NULL;
    }

    if (fun->buildin) {
        // 只支持为 xscript 函数创建协程
        return NULL;
    }

    lgx_co_t *co = (lgx_co_t *)xcalloc(1, sizeof(lgx_co_t));
    if (!co) {
        return NULL;
    }

    if (lgx_co_stack_init(&co->stack, fun->stack_size > 16 ? fun->stack_size : 16)) {
        xfree(co);
        return NULL;
    }

    if (vm->co_running) {
        vm->co_running->ref_cnt ++;
        co->parent = vm->co_running;
    }
    co->pc = fun->addr;
    co->on_yield = NULL;

    co->vm = vm;

    co->status = CO_READY;
    lgx_list_add_tail(&co->head, &vm->co_ready);

    // 初始化函数
    lgx_co_set_function(co, 0, fun);
    // 写入返回值地址
    lgx_co_set_long(co, 1, 1);
    // 写入返回地址
    lgx_co_set_long(co, 2, -1);
    // 写入堆栈地址
    lgx_co_set_long(co, 3, -1);

    co->id = ++vm->co_id;
    vm->co_count ++;

    return co;
}